

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_CutDsdBalanceEval_rec
              (If_DsdMan_t *p,int Id,int *pTimes,int *pnSupp,Vec_Int_t *vAig,int *piLit,int nSuppAll
              ,int *pArea,char *pPermLits)

{
  Vec_Wec_t *p_00;
  int iVar1;
  int iVar2;
  int c;
  If_DsdObj_t *pObj_00;
  Vec_Int_t *p_01;
  bool bVar3;
  int local_204;
  int local_198 [2];
  int pFaninLits_2 [15];
  int pCounter [15];
  int nCounter;
  int fXorFunc;
  int fXor;
  int Result;
  int Delay;
  int iFanin_2;
  int i_2;
  Vec_Int_t *vCover;
  int pFaninLits_1 [15];
  int Delays_1 [15];
  int local_74;
  int local_70;
  int iFanin_1;
  int i_1;
  int pFaninLits [3];
  int Delays [3];
  int iFanin;
  int i;
  int iCutVar;
  If_DsdObj_t *pObj;
  int *piLit_local;
  Vec_Int_t *vAig_local;
  int *pnSupp_local;
  int *pTimes_local;
  int Id_local;
  If_DsdMan_t *p_local;
  
  pObj_00 = If_DsdVecObj(&p->vObjs,Id);
  iVar1 = If_DsdObjType(pObj_00);
  if (iVar1 == 2) {
    iVar1 = Abc_Lit2Var((int)pPermLits[*pnSupp]);
    if (vAig != (Vec_Int_t *)0x0) {
      iVar2 = Abc_LitIsCompl((int)pPermLits[*pnSupp]);
      iVar2 = Abc_Var2Lit(iVar1,iVar2);
      *piLit = iVar2;
    }
    *pnSupp = *pnSupp + 1;
    p_local._4_4_ = pTimes[iVar1];
  }
  else {
    iVar1 = If_DsdObjType(pObj_00);
    if (iVar1 == 5) {
      Delays[2] = 0;
      while( true ) {
        iVar1 = If_DsdObjFaninNum(pObj_00);
        bVar3 = false;
        if (Delays[2] < iVar1) {
          Delays[1] = If_DsdObjFaninLit(pObj_00,Delays[2]);
          bVar3 = Delays[1] != 0;
        }
        if (!bVar3) {
          if (vAig == (Vec_Int_t *)0x0) {
            *pArea = *pArea + 3;
          }
          else {
            iVar1 = If_LogCreateMux(vAig,iFanin_1,i_1,pFaninLits[0],nSuppAll);
            *piLit = iVar1;
          }
          iVar1 = Abc_MaxInt(pFaninLits[2],Delays[0]);
          iVar1 = Abc_MaxInt(pFaninLits[1],iVar1);
          return iVar1 + 2;
        }
        iVar1 = Abc_Lit2Var(Delays[1]);
        iVar1 = If_CutDsdBalanceEval_rec
                          (p,iVar1,pTimes,pnSupp,vAig,&iFanin_1 + Delays[2],nSuppAll,pArea,pPermLits
                          );
        pFaninLits[(long)Delays[2] + 1] = iVar1;
        if (pFaninLits[(long)Delays[2] + 1] == -1) break;
        if (vAig != (Vec_Int_t *)0x0) {
          iVar1 = (&iFanin_1)[Delays[2]];
          iVar2 = Abc_LitIsCompl(Delays[1]);
          iVar1 = Abc_LitNotCond(iVar1,iVar2);
          (&iFanin_1)[Delays[2]] = iVar1;
        }
        Delays[2] = Delays[2] + 1;
      }
      p_local._4_4_ = -1;
    }
    else {
      iVar1 = If_DsdObjType(pObj_00);
      if (iVar1 == 6) {
        p_00 = p->vIsops[*(uint *)&pObj_00->field_0x4 >> 0x1b];
        iVar1 = If_DsdObjTruthId(p,pObj_00);
        p_01 = Vec_WecEntry(p_00,iVar1);
        iVar1 = Vec_IntSize(p_01);
        if (iVar1 == 0) {
          p_local._4_4_ = -1;
        }
        else {
          local_70 = 0;
          while( true ) {
            iVar1 = If_DsdObjFaninNum(pObj_00);
            bVar3 = false;
            if (local_70 < iVar1) {
              local_74 = If_DsdObjFaninLit(pObj_00,local_70);
              bVar3 = local_74 != 0;
            }
            if (!bVar3) {
              iVar1 = If_CutSopBalanceEvalInt
                                (p_01,pFaninLits_1 + 0xe,(int *)&vCover,vAig,piLit,nSuppAll,pArea);
              return iVar1;
            }
            iVar1 = Abc_Lit2Var(local_74);
            iVar1 = If_CutDsdBalanceEval_rec
                              (p,iVar1,pTimes,pnSupp,vAig,pFaninLits_1 + (long)local_70 + -2,
                               nSuppAll,pArea,pPermLits);
            pFaninLits_1[(long)local_70 + 0xe] = iVar1;
            if (pFaninLits_1[(long)local_70 + 0xe] == -1) break;
            if (vAig != (Vec_Int_t *)0x0) {
              iVar1 = pFaninLits_1[(long)local_70 + -2];
              iVar2 = Abc_LitIsCompl(local_74);
              iVar1 = Abc_LitNotCond(iVar1,iVar2);
              pFaninLits_1[(long)local_70 + -2] = iVar1;
            }
            local_70 = local_70 + 1;
          }
          p_local._4_4_ = -1;
        }
      }
      else {
        iVar1 = If_DsdObjType(pObj_00);
        if ((iVar1 != 3) && (iVar1 = If_DsdObjType(pObj_00), iVar1 != 4)) {
          __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                        ,0x8eb,
                        "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                       );
        }
        fXorFunc = 0;
        iVar1 = If_DsdObjType(pObj_00);
        pCounter[0xe] = (int)(iVar1 == 4);
        pCounter[0xd] = 0;
        Delay = 0;
        while( true ) {
          iVar1 = If_DsdObjFaninNum(pObj_00);
          bVar3 = false;
          if (Delay < iVar1) {
            Result = If_DsdObjFaninLit(pObj_00,Delay);
            bVar3 = Result != 0;
          }
          if (!bVar3) {
            if (0 < pCounter[0xd]) {
              if (vAig == (Vec_Int_t *)0x0) {
                *pArea = ((*(uint *)&pObj_00->field_0x4 >> 0x1b) - 1) + *pArea;
              }
              else {
                iVar1 = If_LogCreateAndXorMulti(vAig,local_198,pCounter[0xd],nSuppAll,pCounter[0xe])
                ;
                *piLit = iVar1;
              }
              return fXorFunc;
            }
            __assert_fail("nCounter > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                          ,0x8fa,
                          "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                         );
          }
          iVar1 = Abc_Lit2Var(Result);
          iVar1 = If_CutDsdBalanceEval_rec
                            (p,iVar1,pTimes,pnSupp,vAig,pFaninLits_2 + (long)Delay + -2,nSuppAll,
                             pArea,pPermLits);
          if (iVar1 == -1) break;
          if (vAig != (Vec_Int_t *)0x0) {
            iVar2 = pFaninLits_2[(long)Delay + -2];
            c = Abc_LitIsCompl(Result);
            iVar2 = Abc_LitNotCond(iVar2,c);
            pFaninLits_2[(long)Delay + -2] = iVar2;
          }
          if (vAig == (Vec_Int_t *)0x0) {
            local_204 = -1;
          }
          else {
            local_204 = pFaninLits_2[(long)Delay + -2];
          }
          fXorFunc = If_LogCounterAddAig(pFaninLits_2 + 0xe,pCounter + 0xd,local_198,iVar1,local_204
                                         ,vAig,nSuppAll,0,pCounter[0xe]);
          Delay = Delay + 1;
        }
        p_local._4_4_ = -1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutDsdBalanceEval_rec( If_DsdMan_t * p, int Id, int * pTimes, int * pnSupp, Vec_Int_t * vAig, int * piLit, int nSuppAll, int * pArea, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var( pPermLits[*pnSupp] );
        if ( vAig ) 
            *piLit = Abc_Var2Lit( iCutVar, Abc_LitIsCompl(pPermLits[*pnSupp]) );
        (*pnSupp)++;
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        int i, iFanin, Delays[3], pFaninLits[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        if ( vAig )
            *piLit = If_LogCreateMux( vAig, pFaninLits[0], pFaninLits[1], pFaninLits[2], nSuppAll );
        else
            *pArea += 3;
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        if ( Vec_IntSize(vCover) == 0 )
            return -1;
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        return If_CutSopBalanceEvalInt( vCover, Delays, pFaninLits, vAig, piLit, nSuppAll, pArea );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int fXorFunc = (If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delay == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
            Result = If_LogCounterAddAig( pCounter, &nCounter, pFaninLits, Delay, vAig ? pFaninLits[i] : -1, vAig, nSuppAll, fXor, fXorFunc );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        if ( vAig )
            *piLit = If_LogCreateAndXorMulti( vAig, pFaninLits, nCounter, nSuppAll, fXorFunc );
        else
            *pArea += (pObj->nFans - 1) * (1 + 2 * fXor);
        return Result;
    }
}